

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O1

Primitive __thiscall
de::Random::
chooseWeighted<deqp::gls::DrawTestSpec::Primitive,deqp::gls::DrawTestSpec::Primitive_const*,float_const*>
          (Random *this,Primitive *first,Primitive *last,float *weight)

{
  int iVar1;
  ulong extraout_RAX;
  ulong uVar2;
  long lVar3;
  Primitive *pPVar4;
  Primitive *pPVar5;
  float fVar6;
  float fVar7;
  
  fVar6 = 0.0;
  if (first != last) {
    iVar1 = 1;
    lVar3 = 0;
    do {
      fVar6 = fVar6 + weight[lVar3];
      lVar3 = (long)iVar1;
      iVar1 = iVar1 + 1;
    } while (first + lVar3 != last);
  }
  fVar7 = deRandom_getFloat(&this->m_rnd);
  pPVar4 = last;
  if (first != last) {
    fVar7 = fVar6 * fVar7 + 0.0;
    iVar1 = 1;
    lVar3 = 0;
    fVar6 = 0.0;
    uVar2 = extraout_RAX;
    pPVar5 = first;
    do {
      fVar6 = fVar6 + weight[lVar3];
      if (fVar7 < fVar6) {
        uVar2 = (ulong)*pPVar5;
      }
      else if (0.0 < weight[lVar3]) {
        pPVar4 = pPVar5;
      }
      if (fVar7 < fVar6) {
        return (Primitive)uVar2;
      }
      lVar3 = (long)iVar1;
      pPVar5 = first + lVar3;
      iVar1 = iVar1 + 1;
    } while (pPVar5 != last);
  }
  return *pPVar4;
}

Assistant:

T Random::chooseWeighted (InputIter first, InputIter last, WeightIter weight)
{
	// Compute weight sum
	float	weightSum	= 0.0f;
	int		ndx;
	for (ndx = 0; (first + ndx) != last; ndx++)
		weightSum += *(weight + ndx);

	// Random point in 0..weightSum
	float p = getFloat(0.0f, weightSum);

	// Find item in range
	InputIter	lastNonZero	= last;
	float		curWeight	= 0.0f;
	for (ndx = 0; (first + ndx) != last; ndx++)
	{
		float w = *(weight + ndx);

		curWeight += w;

		if (p < curWeight)
			return *(first + ndx);
		else if (w > 0.0f)
			lastNonZero = first + ndx;
	}

	DE_ASSERT(lastNonZero != last);
	return *lastNonZero;
}